

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfbvthandler_p.cpp
# Opt level: O2

int __thiscall QFbVtHandler::qt_metacall(QFbVtHandler *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  undefined4 in_register_00000014;
  
  _id_00 = QObject::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if (-1 < (int)_id_00) {
    if (_c == RegisterMethodArgumentMetaType) {
      if (_id_00 < 4) {
        *(undefined8 *)*_a = 0;
      }
    }
    else {
      if (_c != InvokeMetaMethod) {
        return _id_00;
      }
      if (_id_00 < 4) {
        qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
      }
    }
    _id_00 = _id_00 - 4;
  }
  return _id_00;
}

Assistant:

int QFbVtHandler::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 4)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 4;
    }
    return _id;
}